

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

size_t __thiscall
kws::Parser::FindClosingChar
          (Parser *this,char openChar,char closeChar,size_t pos,bool noComment,string *buffer)

{
  char cVar1;
  pointer pcVar2;
  char *pcVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  long lVar7;
  char *pcVar8;
  const_iterator it;
  pointer ppVar9;
  string stream;
  undefined1 *local_50;
  char *local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  pcVar2 = (buffer->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + buffer->_M_string_length);
  pcVar8 = local_48;
  if (buffer->_M_string_length == 0) {
    pcVar3 = (this->m_Buffer)._M_dataplus._M_p;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&local_50,0,pcVar8,(ulong)pcVar3);
    pcVar8 = local_48;
    if (noComment) {
      pcVar3 = (this->m_BufferNoComment)._M_dataplus._M_p;
      strlen(pcVar3);
      std::__cxx11::string::_M_replace((ulong)&local_50,0,pcVar8,(ulong)pcVar3);
    }
  }
  ppVar4 = (this->m_CommentPositions).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->m_CommentPositions).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = 1;
  do {
    pos = pos + 1;
    if (local_48 <= pos) {
      pos = 0xffffffffffffffff;
      break;
    }
    cVar1 = local_50[pos];
    ppVar6 = (this->m_IfElseEndifList).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (cVar1 == openChar || cVar1 == closeChar) {
      for (; ppVar6 != (this->m_IfElseEndifList).
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; ppVar6 = ppVar6 + 1) {
        pcVar8 = (char *)pos;
        ppVar9 = ppVar4;
        if (noComment && ppVar4 != ppVar5) {
          do {
            if (pos < (char *)ppVar9->first) break;
            pcVar8 = (char *)ppVar9->first + (long)pcVar8 + -ppVar9->second;
            ppVar9 = ppVar9 + 1;
          } while (ppVar9 != ppVar5);
        }
        if (((char *)ppVar6->first < pcVar8) && (pcVar8 < (char *)ppVar6->second))
        goto LAB_0012238d;
      }
      if (cVar1 == openChar) {
        lVar7 = lVar7 + 1;
      }
      else {
        lVar7 = lVar7 - (ulong)(cVar1 == closeChar);
      }
    }
LAB_0012238d:
  } while (lVar7 != 0);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return (size_t)(char *)pos;
}

Assistant:

size_t Parser::FindClosingChar(char openChar, char closeChar,
                               size_t pos,bool noComment,std::string buffer) const
{
  std::string stream = buffer;
  if (buffer.empty()) {
    stream = m_Buffer.c_str();
    if(noComment)
      {
      stream = m_BufferNoComment.c_str();
      }
  }

  size_t open = 1;
  for(size_t i=pos+1;i<stream.length();i++)
    {
    if(stream[i] == openChar || stream[i] == closeChar)
      {
      bool skip = false;
      // We want to check that we are not in the #if/#else/#endif thing
      auto itLS = m_IfElseEndifList.begin();
      while(itLS != m_IfElseEndifList.end())
        {
        size_t j = i;
        if(noComment)
          {
          j = this->GetPositionWithoutComments(i);
          }
        if(j>(*itLS).first && j<(*itLS).second)
          {
          skip = true;
          break;
          }
        itLS++;
        }

      if(!skip)
        {
        if(stream[i] == openChar)
          {
          open++;
          }
        else if(stream[i] == closeChar)
          {
          open--;
          }
        }
      }
    if(open == 0)
      {
      return i;
      }
    }
  return std::string::npos; // closing char not found
}